

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O3

void opj_v4dwt_decode_step2_sse
               (opj_v4_t *l,opj_v4_t *w,OPJ_UINT32 start,OPJ_UINT32 end,OPJ_UINT32 m,__m128 c)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  opj_v4_t *poVar4;
  uint uVar5;
  OPJ_UINT32 OVar6;
  int iVar7;
  opj_v4_t *poVar8;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  OVar6 = m;
  if (end < m) {
    OVar6 = end;
  }
  poVar8 = w + ((ulong)(start * 2) - 3);
  if (start == 0) {
    poVar8 = l;
  }
  poVar4 = w + start * 2;
  fVar9 = (float)poVar8->f[0];
  fVar10 = (float)poVar8->f[1];
  fVar11 = (float)poVar8->f[2];
  fVar12 = (float)poVar8->f[3];
  uVar5 = start + 3;
  while (uVar5 < OVar6) {
    fVar13 = fVar9 + (float)poVar4->f[0];
    fVar14 = fVar10 + (float)poVar4->f[1];
    fVar15 = fVar11 + (float)poVar4->f[2];
    fVar16 = fVar12 + (float)poVar4->f[3];
    fVar9 = (float)poVar4[6].f[0];
    fVar10 = *(float *)((long)poVar4 + 100);
    fVar11 = *(float *)((long)poVar4 + 0x68);
    fVar12 = *(float *)((long)poVar4 + 0x6c);
    poVar4[-1].f[0] = (OPJ_FLOAT32)(fVar13 * c[0] + (float)poVar4[-1].f[0]);
    *(float *)((long)poVar4 + -0xc) = fVar14 * c[1] + *(float *)((long)poVar4 + -0xc);
    *(float *)((long)poVar4 + -8) = fVar15 * in_XMM0_Dc + *(float *)((long)poVar4 + -8);
    *(float *)((long)poVar4 + -4) = fVar16 * in_XMM0_Dd + *(float *)((long)poVar4 + -4);
    poVar4[1].f[0] =
         (OPJ_FLOAT32)(((float)poVar4->f[0] + (float)poVar4[2].f[0]) * c[0] + (float)poVar4[1].f[0])
    ;
    *(float *)((long)poVar4 + 0x14) =
         ((float)poVar4->f[1] + *(float *)((long)poVar4 + 0x24)) * c[1] +
         *(float *)((long)poVar4 + 0x14);
    *(float *)((long)poVar4 + 0x18) =
         ((float)poVar4->f[2] + *(float *)((long)poVar4 + 0x28)) * in_XMM0_Dc +
         *(float *)((long)poVar4 + 0x18);
    *(float *)((long)poVar4 + 0x1c) =
         ((float)poVar4->f[3] + *(float *)((long)poVar4 + 0x2c)) * in_XMM0_Dd +
         *(float *)((long)poVar4 + 0x1c);
    poVar4[3].f[0] =
         (OPJ_FLOAT32)
         (((float)poVar4[2].f[0] + (float)poVar4[4].f[0]) * c[0] + (float)poVar4[3].f[0]);
    *(float *)((long)poVar4 + 0x34) =
         (*(float *)((long)poVar4 + 0x24) + *(float *)((long)poVar4 + 0x44)) * c[1] +
         *(float *)((long)poVar4 + 0x34);
    *(float *)((long)poVar4 + 0x38) =
         (*(float *)((long)poVar4 + 0x28) + *(float *)((long)poVar4 + 0x48)) * in_XMM0_Dc +
         *(float *)((long)poVar4 + 0x38);
    *(float *)((long)poVar4 + 0x3c) =
         (*(float *)((long)poVar4 + 0x2c) + *(float *)((long)poVar4 + 0x4c)) * in_XMM0_Dd +
         *(float *)((long)poVar4 + 0x3c);
    poVar4[5].f[0] = (OPJ_FLOAT32)(((float)poVar4[4].f[0] + fVar9) * c[0] + (float)poVar4[5].f[0]);
    *(float *)((long)poVar4 + 0x54) =
         (*(float *)((long)poVar4 + 0x44) + fVar10) * c[1] + *(float *)((long)poVar4 + 0x54);
    *(float *)((long)poVar4 + 0x58) =
         (*(float *)((long)poVar4 + 0x48) + fVar11) * in_XMM0_Dc + *(float *)((long)poVar4 + 0x58);
    *(float *)((long)poVar4 + 0x5c) =
         (*(float *)((long)poVar4 + 0x4c) + fVar12) * in_XMM0_Dd + *(float *)((long)poVar4 + 0x5c);
    poVar4 = poVar4 + 8;
    uVar5 = start + 7;
    start = start + 4;
  }
  iVar7 = OVar6 - start;
  if (start <= OVar6 && iVar7 != 0) {
    do {
      fVar13 = (float)poVar4->f[0];
      pfVar1 = (float *)(poVar4->f + 1);
      pfVar2 = (float *)(poVar4->f + 2);
      pfVar3 = (float *)(poVar4->f + 3);
      poVar4[-1].f[0] = (OPJ_FLOAT32)((fVar9 + fVar13) * c[0] + (float)poVar4[-1].f[0]);
      *(float *)((long)poVar4 + -0xc) = (fVar10 + *pfVar1) * c[1] + *(float *)((long)poVar4 + -0xc);
      *(float *)((long)poVar4 + -8) =
           (fVar11 + *pfVar2) * in_XMM0_Dc + *(float *)((long)poVar4 + -8);
      *(float *)((long)poVar4 + -4) =
           (fVar12 + *pfVar3) * in_XMM0_Dd + *(float *)((long)poVar4 + -4);
      poVar4 = poVar4 + 2;
      iVar7 = iVar7 + -1;
      fVar9 = fVar13;
      fVar10 = *pfVar1;
      fVar11 = *pfVar2;
      fVar12 = *pfVar3;
    } while (iVar7 != 0);
  }
  if (m < end) {
    if (m + 1 != end) {
      __assert_fail("m + 1 == end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/dwt.c"
                    ,0x93f,
                    "void opj_v4dwt_decode_step2_sse(opj_v4_t *, opj_v4_t *, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, __m128)"
                   );
    }
    poVar4[-1].f[0] = (OPJ_FLOAT32)((c[0] + c[0]) * (float)poVar4[-2].f[0] + (float)poVar4[-1].f[0])
    ;
    *(float *)((long)poVar4 + -0xc) =
         (c[1] + c[1]) * *(float *)((long)poVar4 + -0x1c) + *(float *)((long)poVar4 + -0xc);
    *(float *)((long)poVar4 + -8) =
         (in_XMM0_Dc + in_XMM0_Dc) * *(float *)((long)poVar4 + -0x18) +
         *(float *)((long)poVar4 + -8);
    *(float *)((long)poVar4 + -4) =
         (in_XMM0_Dd + in_XMM0_Dd) * *(float *)((long)poVar4 + -0x14) +
         *(float *)((long)poVar4 + -4);
  }
  return;
}

Assistant:

static void opj_v4dwt_decode_step2_sse(opj_v4_t* l, opj_v4_t* w,
                                       OPJ_UINT32 start,
                                       OPJ_UINT32 end,
                                       OPJ_UINT32 m,
                                       __m128 c)
{
    __m128* OPJ_RESTRICT vl = (__m128*) l;
    __m128* OPJ_RESTRICT vw = (__m128*) w;
    OPJ_UINT32 i;
    OPJ_UINT32 imax = opj_uint_min(end, m);
    __m128 tmp1, tmp2, tmp3;
    if (start == 0) {
        tmp1 = vl[0];
    } else {
        vw += start * 2;
        tmp1 = vw[-3];
    }

    i = start;

    /* 4x loop unrolling */
    for (; i + 3 < imax; i += 4) {
        __m128 tmp4, tmp5, tmp6, tmp7, tmp8, tmp9;
        tmp2 = vw[-1];
        tmp3 = vw[ 0];
        tmp4 = vw[ 1];
        tmp5 = vw[ 2];
        tmp6 = vw[ 3];
        tmp7 = vw[ 4];
        tmp8 = vw[ 5];
        tmp9 = vw[ 6];
        vw[-1] = _mm_add_ps(tmp2, _mm_mul_ps(_mm_add_ps(tmp1, tmp3), c));
        vw[ 1] = _mm_add_ps(tmp4, _mm_mul_ps(_mm_add_ps(tmp3, tmp5), c));
        vw[ 3] = _mm_add_ps(tmp6, _mm_mul_ps(_mm_add_ps(tmp5, tmp7), c));
        vw[ 5] = _mm_add_ps(tmp8, _mm_mul_ps(_mm_add_ps(tmp7, tmp9), c));
        tmp1 = tmp9;
        vw += 8;
    }

    for (; i < imax; ++i) {
        tmp2 = vw[-1];
        tmp3 = vw[ 0];
        vw[-1] = _mm_add_ps(tmp2, _mm_mul_ps(_mm_add_ps(tmp1, tmp3), c));
        tmp1 = tmp3;
        vw += 2;
    }
    if (m < end) {
        assert(m + 1 == end);
        c = _mm_add_ps(c, c);
        c = _mm_mul_ps(c, vw[-2]);
        vw[-1] = _mm_add_ps(vw[-1], c);
    }
}